

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_create_schema.cpp
# Opt level: O3

SourceResultType __thiscall
duckdb::PhysicalCreateSchema::GetData
          (PhysicalCreateSchema *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  ClientContext *pCVar1;
  bool bVar2;
  pointer pCVar3;
  Catalog *this_00;
  type info;
  BinderException *this_01;
  string local_40;
  
  pCVar1 = context->client;
  pCVar3 = unique_ptr<duckdb::CreateSchemaInfo,_std::default_delete<duckdb::CreateSchemaInfo>,_true>
           ::operator->(&this->info);
  this_00 = Catalog::GetCatalog(pCVar1,&(pCVar3->super_CreateInfo).catalog);
  bVar2 = Catalog::IsSystemCatalog(this_00);
  if (!bVar2) {
    pCVar1 = context->client;
    info = unique_ptr<duckdb::CreateSchemaInfo,_std::default_delete<duckdb::CreateSchemaInfo>,_true>
           ::operator*(&this->info);
    Catalog::CreateSchema(this_00,pCVar1,info);
    return FINISHED;
  }
  this_01 = (BinderException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Cannot create schema in system catalog","");
  BinderException::BinderException(this_01,&local_40);
  __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

SourceResultType PhysicalCreateSchema::GetData(ExecutionContext &context, DataChunk &chunk,
                                               OperatorSourceInput &input) const {
	auto &catalog = Catalog::GetCatalog(context.client, info->catalog);
	if (catalog.IsSystemCatalog()) {
		throw BinderException("Cannot create schema in system catalog");
	}
	catalog.CreateSchema(context.client, *info);

	return SourceResultType::FINISHED;
}